

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5LocaleFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  void *pvVar1;
  undefined8 uVar2;
  int iVar3;
  int n;
  char *__src;
  char *z;
  char *pcVar4;
  u8 enc;
  int n_00;
  code *xDel;
  size_t __n;
  
  __src = (char *)sqlite3ValueText(*apArg,'\x01');
  iVar3 = sqlite3ValueBytes(*apArg,'\x01');
  z = (char *)sqlite3ValueText(apArg[1],'\x01');
  n = sqlite3ValueBytes(apArg[1],'\x01');
  if ((__src == (char *)0x0) || (*__src == '\0')) {
    enc = '\x01';
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
  }
  else {
    pvVar1 = pCtx->pFunc->pUserData;
    n_00 = n + iVar3 + 0x11;
    pcVar4 = (char *)sqlite3_malloc(n_00);
    if (pcVar4 == (char *)0x0) {
      sqlite3_result_error_nomem(pCtx);
      return;
    }
    uVar2 = *(undefined8 *)((long)pvVar1 + 0x68);
    *(undefined8 *)pcVar4 = *(undefined8 *)((long)pvVar1 + 0x60);
    *(undefined8 *)(pcVar4 + 8) = uVar2;
    __n = (size_t)iVar3;
    memcpy(pcVar4 + 0x10,__src,__n);
    pcVar4[__n + 0x10] = '\0';
    if (z != (char *)0x0) {
      memcpy(pcVar4 + __n + 0x11,z,(long)n);
    }
    xDel = sqlite3_free;
    enc = '\0';
    z = pcVar4;
    n = n_00;
  }
  setResultStrOrError(pCtx,z,n,enc,xDel);
  return;
}

Assistant:

static void fts5LocaleFunc(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apArg           /* Function arguments */
){
  const char *zLocale = 0;
  int nLocale = 0;
  const char *zText = 0;
  int nText = 0;

  assert( nArg==2 );
  UNUSED_PARAM(nArg);

  zLocale = (const char*)sqlite3_value_text(apArg[0]);
  nLocale = sqlite3_value_bytes(apArg[0]);

  zText = (const char*)sqlite3_value_text(apArg[1]);
  nText = sqlite3_value_bytes(apArg[1]);

  if( zLocale==0 || zLocale[0]=='\0' ){
    sqlite3_result_text(pCtx, zText, nText, SQLITE_TRANSIENT);
  }else{
    Fts5Global *p = (Fts5Global*)sqlite3_user_data(pCtx);
    u8 *pBlob = 0;
    u8 *pCsr = 0;
    int nBlob = 0;

    nBlob = FTS5_LOCALE_HDR_SIZE + nLocale + 1 + nText;
    pBlob = (u8*)sqlite3_malloc(nBlob);
    if( pBlob==0 ){
      sqlite3_result_error_nomem(pCtx);
      return;
    }

    pCsr = pBlob;
    memcpy(pCsr, (const u8*)p->aLocaleHdr, FTS5_LOCALE_HDR_SIZE);
    pCsr += FTS5_LOCALE_HDR_SIZE;
    memcpy(pCsr, zLocale, nLocale);
    pCsr += nLocale;
    (*pCsr++) = 0x00;
    if( zText ) memcpy(pCsr, zText, nText);
    assert( &pCsr[nText]==&pBlob[nBlob] );

    sqlite3_result_blob(pCtx, pBlob, nBlob, sqlite3_free);
  }
}